

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O2

GLuint glcts::findLSB(GLuint input)

{
  GLuint result;
  GLuint GVar1;
  ulong uVar2;
  
  uVar2 = (ulong)input;
  if (input == 0) {
    GVar1 = 0xffffffff;
  }
  else {
    GVar1 = 0;
    for (; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1) {
      GVar1 = GVar1 + 1;
    }
  }
  return GVar1;
}

Assistant:

static GLuint findLSB(GLuint input)
{
	if (!input)
	{
		return -1;
	}
	for (GLuint result = 0;; ++result)
	{
		if (input & 1)
		{
			return result;
		}
		input >>= 1;
	}
}